

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateProgramInputLocationBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask)

{
  int iVar1;
  NodeType NVar2;
  ShaderType SVar3;
  Node *pNVar4;
  Node *pNVar5;
  SharedPtrStateBase *pSVar6;
  ResourceTestCase *pRVar7;
  deInt32 *pdVar8;
  SharedPtr variable;
  SharedPtr variable_3;
  SharedPtr layout;
  SharedPtr variable_5;
  SharedPtr input;
  undefined1 local_a8 [8];
  SharedPtrStateBase *pSStack_a0;
  MatrixOrder local_98;
  SharedPtr local_88;
  SharedPtr local_78;
  SharedPtr local_68;
  Node *local_58;
  SharedPtrStateBase *pSStack_50;
  TestNode *local_48;
  Context *local_40;
  ProgramResourceQueryTestTarget local_38;
  
  pNVar5 = parentStructure->m_ptr;
  NVar2 = pNVar5->m_type;
  local_48 = &targetGroup->super_TestNode;
  local_40 = context;
  if (NVar2 == TYPE_DEFAULT_BLOCK) {
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_STORAGE_QUALIFIER;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    pSVar6 = parentStructure->m_state;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1fc8;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 0;
    pSStack_50 = (SharedPtrStateBase *)0x0;
    local_58 = pNVar4;
    pSStack_50 = (SharedPtrStateBase *)operator_new(0x20);
    pSStack_50->strongRefCount = 0;
    pSStack_50->weakRefCount = 0;
    pSStack_50->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSStack_50[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSStack_50->strongRefCount = 1;
    pSStack_50->weakRefCount = 1;
  }
  else {
    pSStack_50 = parentStructure->m_state;
    local_58 = pNVar5;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pSStack_50->weakRefCount = pSStack_50->weakRefCount + 1;
      UNLOCK();
    }
  }
  SVar3 = getShaderMaskFirstStage(presentShadersMask);
  if (SVar3 == SHADERTYPE_FRAGMENT) {
LAB_015a140b:
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = local_58;
    (pNVar5->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_a0 = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_78,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_40,(SharedPtr *)local_a8,(ProgramResourceQueryTestTarget *)&local_78,
               "var");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_a8 = (undefined1  [8])0x0;
      (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_a0->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_a0 = (SharedPtrStateBase *)0x0;
    }
    pNVar5 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_58;
    (pNVar5->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
    pNVar5[1]._vptr_Node = (_func_int **)local_a8;
    *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_a0;
    *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_98;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_a0 = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_40,(SharedPtr *)local_a8,(ProgramResourceQueryTestTarget *)&local_88,
               "var_explicit_location");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_a8 = (undefined1  [8])0x0;
      (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_a0->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_a0 = (SharedPtrStateBase *)0x0;
    }
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &(local_78.m_state)->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &(local_78.m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar5 = (Node *)operator_new(0x20);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_STRUCT_MEMBER;
    (pNVar5->m_enclosingNode).m_ptr = local_58;
    (pNVar5->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b20f8;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_a0 = pSVar6;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_40,&local_78,(ProgramResourceQueryTestTarget *)&local_88,"var_struct");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &(local_78.m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_a0->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &pSStack_a0->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar5 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_58;
    (pNVar5->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
    pNVar5[1]._vptr_Node = (_func_int **)local_a8;
    *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_a0;
    *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_98;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pNVar4 = (Node *)operator_new(0x20);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_STRUCT_MEMBER;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b20f8;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_a0 = pSVar6;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar4;
    (pNVar5->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_40,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "var_struct_explicit_location");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &(local_88.m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_a0->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &pSStack_a0->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &(local_78.m_state)->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &(local_78.m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar5->m_enclosingNode).m_ptr = local_58;
    (pNVar5->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 0xffffffff;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_a0 = pSVar6;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_40,&local_78,(ProgramResourceQueryTestTarget *)&local_88,"var_array");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &(local_78.m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_a0->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &pSStack_a0->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar5 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_58;
    (pNVar5->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
    pNVar5[1]._vptr_Node = (_func_int **)local_a8;
    *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_a0;
    *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_98;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 0xffffffff;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_a0 = pSVar6;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar4;
    (pNVar5->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_40,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "var_array_explicit_location");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
LAB_015a1fb2:
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &(local_88.m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_a0->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      iVar1 = *pdVar8;
      UNLOCK();
joined_r0x015a0ffe:
      if (iVar1 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &pSStack_a0->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
  }
  else {
    if (SVar3 == SHADERTYPE_VERTEX) {
      pNVar5 = (Node *)operator_new(0x28);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar5->m_type = TYPE_VARIABLE;
      (pNVar5->m_enclosingNode).m_ptr = local_58;
      (pNVar5->m_enclosingNode).m_state = pSStack_50;
      if (pSStack_50 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar8 = *pdVar8 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
      *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
      pSStack_a0 = (SharedPtrStateBase *)0x0;
      local_a8 = (undefined1  [8])pNVar5;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      pSStack_a0 = pSVar6;
      pRVar7 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_78,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar7,local_40,(SharedPtr *)local_a8,(ProgramResourceQueryTestTarget *)&local_78,
                 "var");
      tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
      pdVar8 = &pSVar6->strongRefCount;
      LOCK();
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &pSStack_a0->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
      pNVar5 = (Node *)operator_new(0x38);
      glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
      (pNVar5->m_enclosingNode).m_ptr = local_58;
      (pNVar5->m_enclosingNode).m_state = pSStack_50;
      if (pSStack_50 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar8 = *pdVar8 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
      pNVar5[1]._vptr_Node = (_func_int **)local_a8;
      *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_a0;
      *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_98;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar5;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_78.m_state = pSVar6;
      pNVar4 = (Node *)operator_new(0x28);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar4->m_type = TYPE_VARIABLE;
      (pNVar4->m_enclosingNode).m_ptr = pNVar5;
      (pNVar4->m_enclosingNode).m_state = pSVar6;
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
      *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
      pSStack_a0 = (SharedPtrStateBase *)0x0;
      local_a8 = (undefined1  [8])pNVar4;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      pSStack_a0 = pSVar6;
      pRVar7 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar7,local_40,(SharedPtr *)local_a8,(ProgramResourceQueryTestTarget *)&local_88,
                 "var_explicit_location");
      tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
      pdVar8 = &pSVar6->strongRefCount;
      LOCK();
      *pdVar8 = *pdVar8 + -1;
      iVar1 = *pdVar8;
      UNLOCK();
      goto joined_r0x015a0ffe;
    }
    if (NVar2 != TYPE_DEFAULT_BLOCK) goto LAB_015a140b;
    if ((SVar3 & ~SHADERTYPE_FRAGMENT) == SHADERTYPE_GEOMETRY) {
      pNVar5 = (Node *)operator_new(0x28);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar5->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar5->m_enclosingNode).m_ptr = local_58;
      (pNVar5->m_enclosingNode).m_state = pSStack_50;
      if (pSStack_50 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar8 = *pdVar8 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
      *(undefined4 *)&pNVar5[1]._vptr_Node = 0xfffffffe;
      pSStack_a0 = (SharedPtrStateBase *)0x0;
      local_a8 = (undefined1  [8])pNVar5;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      pSStack_a0 = pSVar6;
      pNVar4 = (Node *)operator_new(0x28);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar4->m_type = TYPE_VARIABLE;
      (pNVar4->m_enclosingNode).m_ptr = pNVar5;
      (pNVar4->m_enclosingNode).m_state = pSVar6;
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
      *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar4;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_78.m_state = pSVar6;
      pRVar7 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar7,local_40,&local_78,(ProgramResourceQueryTestTarget *)&local_88,"var");
      tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
      pdVar8 = &pSVar6->strongRefCount;
      LOCK();
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &(local_78.m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (local_78.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_78.m_state = (SharedPtrStateBase *)0x0;
      }
      if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar8 = &pSStack_a0->strongRefCount;
        *pdVar8 = *pdVar8 + -1;
        UNLOCK();
        if (*pdVar8 == 0) {
          local_a8 = (undefined1  [8])0x0;
          (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar8 = &pSStack_a0->weakRefCount;
        *pdVar8 = *pdVar8 + -1;
        UNLOCK();
        if (*pdVar8 == 0) {
          if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
            (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
          }
          pSStack_a0 = (SharedPtrStateBase *)0x0;
        }
      }
      pNVar5 = (Node *)operator_new(0x38);
      glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
      (pNVar5->m_enclosingNode).m_ptr = local_58;
      (pNVar5->m_enclosingNode).m_state = pSStack_50;
      if (pSStack_50 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar8 = *pdVar8 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
      pNVar5[1]._vptr_Node = (_func_int **)local_a8;
      *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_a0;
      *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_98;
      local_78.m_state = (SharedPtrStateBase *)0x0;
      local_78.m_ptr = pNVar5;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_78.m_state = pSVar6;
      pNVar4 = (Node *)operator_new(0x28);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar4->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar4->m_enclosingNode).m_ptr = pNVar5;
      (pNVar4->m_enclosingNode).m_state = pSVar6;
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
      *(undefined4 *)&pNVar4[1]._vptr_Node = 0xfffffffe;
      pSStack_a0 = (SharedPtrStateBase *)0x0;
      local_a8 = (undefined1  [8])pNVar4;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      pSStack_a0 = pSVar6;
      pNVar5 = (Node *)operator_new(0x28);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar5->m_type = TYPE_VARIABLE;
      (pNVar5->m_enclosingNode).m_ptr = pNVar4;
      (pNVar5->m_enclosingNode).m_state = pSVar6;
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
      *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
      local_88.m_state = (SharedPtrStateBase *)0x0;
      local_88.m_ptr = pNVar5;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_88.m_state = pSVar6;
      pRVar7 = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
      ResourceTestCase::ResourceTestCase
                (pRVar7,local_40,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
                 "var_explicit_location");
      tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
      goto LAB_015a1fb2;
    }
    if (SVar3 != SHADERTYPE_TESSELLATION_EVALUATION) goto LAB_015a2083;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_STORAGE_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar6 = parentStructure->m_state;
    (pNVar5->m_enclosingNode).m_state = pSVar6;
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1fc8;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 5;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar5->m_enclosingNode).m_ptr = local_58;
    (pNVar5->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 0xfffffffe;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_a0 = pSVar6;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_40,&local_88,(ProgramResourceQueryTestTarget *)&local_68,"var");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &(local_88.m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_a0->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &pSStack_a0->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar5 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_58;
    (pNVar5->m_enclosingNode).m_state = pSStack_50;
    if (pSStack_50 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
    pNVar5[1]._vptr_Node = (_func_int **)local_a8;
    *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_a0;
    *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_98;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 0xfffffffe;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_a0 = pSVar6;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar4;
    (pNVar5->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_68.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase(pRVar7,local_40,&local_68,&local_38,"var_explicit_location");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_68.m_ptr = (Node *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &(local_68.m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_68.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_a0->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &pSStack_a0->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &(local_88.m_state)->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &(local_88.m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_88.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_a0 = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_40,(SharedPtr *)local_a8,(ProgramResourceQueryTestTarget *)&local_88,
               "patch_var");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_a8 = (undefined1  [8])0x0;
      (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_a0->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_a0 = (SharedPtrStateBase *)0x0;
    }
    pNVar5 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
    pNVar5[1]._vptr_Node = (_func_int **)local_a8;
    *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_a0;
    *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_98;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_a0 = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_40,(SharedPtr *)local_a8,(ProgramResourceQueryTestTarget *)&local_68,
               "patch_var_explicit_location");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_a8 = (undefined1  [8])0x0;
      (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_a0->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_a0 = (SharedPtrStateBase *)0x0;
    }
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &(local_88.m_state)->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &(local_88.m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_88.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar5 = (Node *)operator_new(0x20);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_STRUCT_MEMBER;
    (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b20f8;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_a0 = pSVar6;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_40,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "patch_var_struct");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &(local_88.m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_a0->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &pSStack_a0->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar5 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
    pNVar5[1]._vptr_Node = (_func_int **)local_a8;
    *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_a0;
    *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_98;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pNVar4 = (Node *)operator_new(0x20);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_STRUCT_MEMBER;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b20f8;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_a0 = pSVar6;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar4;
    (pNVar5->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_68.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_40,&local_68,&local_38,"patch_var_struct_explicit_location");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_68.m_ptr = (Node *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &(local_68.m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_68.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_a0->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &pSStack_a0->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &(local_88.m_state)->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &(local_88.m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_88.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 0xffffffff;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_a0 = pSVar6;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_40,&local_88,(ProgramResourceQueryTestTarget *)&local_68,
               "patch_var_array");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &(local_88.m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_a0->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &pSStack_a0->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    pNVar5 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_a8,2,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
    (pNVar5->m_enclosingNode).m_state = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
    pNVar5[1]._vptr_Node = (_func_int **)local_a8;
    *(SharedPtrStateBase **)&pNVar5[1].m_type = pSStack_a0;
    *(MatrixOrder *)&pNVar5[1].m_enclosingNode.m_ptr = local_98;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_88.m_state = pSVar6;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar4->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 0xffffffff;
    pSStack_a0 = (SharedPtrStateBase *)0x0;
    local_a8 = (undefined1  [8])pNVar4;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_a0 = pSVar6;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar4;
    (pNVar5->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_68.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
              (&local_38,PROGRAMINTERFACE_PROGRAM_INPUT,0x20);
    ResourceTestCase::ResourceTestCase
              (pRVar7,local_40,&local_68,&local_38,"patch_var_array_explicit_location");
    tcu::TestNode::addChild(local_48,(TestNode *)pRVar7);
    pdVar8 = &pSVar6->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_68.m_ptr = (Node *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &(local_68.m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_68.m_state = (SharedPtrStateBase *)0x0;
    }
    if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_a0->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_a8 = (undefined1  [8])0x0;
        (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &pSStack_a0->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
          (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
        }
        pSStack_a0 = (SharedPtrStateBase *)0x0;
      }
    }
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &(local_88.m_state)->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar8 = &(local_88.m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        if (local_88.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_88.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &(local_78.m_state)->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &(local_78.m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
  }
LAB_015a2083:
  if (pSStack_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &pSStack_50->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_58 = (Node *)0x0;
      (*pSStack_50->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_50->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (pSStack_50 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_50->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateProgramInputLocationBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, deUint32 presentShadersMask)
{
	const bool									inDefaultBlock	= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	input			= (inDefaultBlock)
																	? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_IN)))
																	: (parentStructure);
	const glu::ShaderType						firstStage		= getShaderMaskFirstStage(presentShadersMask);

	if (firstStage == glu::SHADERTYPE_VERTEX)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
	}
	else if (firstStage == glu::SHADERTYPE_FRAGMENT || !inDefaultBlock)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// .var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_struct"));
		}
		// .var_struct_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_struct_explicit_location"));
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array"));
		}
		// .var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_array_explicit_location"));
		}
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_CONTROL ||
			 firstStage == glu::SHADERTYPE_GEOMETRY)
	{
		// arrayed interface

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_EVALUATION)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchInput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_IN));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var"));
		}
		// .var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(input, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "var_explicit_location"));
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays

		// .patch_var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(patchInput, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var"));
		}
		// .patch_var_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchInput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(layout, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_explicit_location"));
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_struct"));
		}
		// .patch_var_struct_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchInput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_struct_explicit_location"));
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_array"));
		}
		// .patch_var_array_explicit_location
		{
			const ResourceDefinition::Node::SharedPtr layout	(new ResourceDefinition::LayoutQualifier(patchInput, glu::Layout(2)));
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(layout));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_PROGRAM_INPUT, PROGRAMRESOURCEPROP_LOCATION), "patch_var_array_explicit_location"));
		}
	}
	else if (firstStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}